

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluObjectWrapper.cpp
# Opt level: O2

void __thiscall glu::ObjectVector::resize(ObjectVector *this,size_t newSize)

{
  long lVar1;
  ulong uVar2;
  value_type_conflict2 local_2c;
  
  lVar1 = (long)(this->m_objects).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_objects).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
  uVar2 = lVar1 >> 2;
  if (newSize == 0) {
    clear(this);
  }
  if (uVar2 < newSize) {
    local_2c = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->m_objects,newSize,&local_2c);
    (**(code **)((long)&this->m_gl->activeShaderProgram + this->m_traits->genFunc))
              ((int)newSize - (int)uVar2,
               lVar1 + (long)(this->m_objects).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start);
  }
  else if (newSize < uVar2) {
    (**(code **)((long)&this->m_gl->activeShaderProgram + this->m_traits->deleteFunc))
              ((int)uVar2 - (int)newSize,
               (this->m_objects).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + newSize);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->m_objects,newSize);
    return;
  }
  return;
}

Assistant:

void ObjectVector::resize (size_t newSize)
{
	const size_t oldSize = m_objects.size();

	if (newSize == 0)
	{
		clear(); // Avoid size_t (unsigned) overflow issues in delete path.
	}
	if (oldSize < newSize)
	{
		m_objects.resize(newSize, 0);
		(m_gl.*m_traits.genFunc)(glw::GLsizei(newSize - oldSize), &m_objects[oldSize]);
	}
	else if (oldSize > newSize)
	{
		(m_gl.*m_traits.deleteFunc)(glw::GLsizei(oldSize - newSize), &m_objects[newSize]);
		m_objects.resize(newSize);
	}
}